

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

char * llvm::itaniumDemangle(char *MangledName,char *Buf,size_t *N,int *Status)

{
  bool bVar1;
  size_t sVar2;
  Node *this;
  size_t sVar3;
  size_t *local_1378;
  Node *AST;
  OutputStream S;
  Db Parser;
  int InternalStatus;
  int *Status_local;
  size_t *N_local;
  char *Buf_local;
  char *MangledName_local;
  
  if ((MangledName == (char *)0x0) || ((Buf != (char *)0x0 && (N == (size_t *)0x0)))) {
    if (Status != (int *)0x0) {
      *Status = -3;
    }
    MangledName_local = (char *)0x0;
  }
  else {
    Parser.ASTAllocator._4108_4_ = 0;
    sVar2 = strlen(MangledName);
    anon_unknown.dwarf_4161a3::Db::Db((Db *)&S.CurrentPackIndex,MangledName,MangledName + sVar2);
    OutputStream::OutputStream((OutputStream *)&AST);
    this = anon_unknown.dwarf_4161a3::Db::parse((Db *)&S.CurrentPackIndex);
    N_local = (size_t *)Buf;
    if (this == (Node *)0x0) {
      Parser.ASTAllocator._4108_4_ = 0xfffffffe;
    }
    else {
      bVar1 = anon_unknown.dwarf_4161a3::initializeOutputStream(Buf,N,(OutputStream *)&AST,0x400);
      if (bVar1) {
        Parser.ASTAllocator._4108_4_ = 0xffffffff;
      }
      else {
        bVar1 = anon_unknown.dwarf_4161a3::
                PODSmallVector<(anonymous_namespace)::ForwardTemplateReference_*,_4UL>::empty
                          ((PODSmallVector<(anonymous_namespace)::ForwardTemplateReference_*,_4UL> *
                           )(Parser.TemplateParams.Inline + 7));
        if (!bVar1) {
          __assert_fail("Parser.ForwardTemplateRefs.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Demangle/ItaniumDemangle.cpp"
                        ,0x1375,"char *llvm::itaniumDemangle(const char *, char *, size_t *, int *)"
                       );
        }
        anon_unknown.dwarf_4161a3::Node::print(this,(OutputStream *)&AST);
        OutputStream::operator+=((OutputStream *)&AST,'\0');
        if (N != (size_t *)0x0) {
          sVar3 = OutputStream::getCurrentPosition((OutputStream *)&AST);
          *N = sVar3;
        }
        N_local = (size_t *)OutputStream::getBuffer((OutputStream *)&AST);
      }
    }
    if (Status != (int *)0x0) {
      *Status = Parser.ASTAllocator._4108_4_;
    }
    if (Parser.ASTAllocator._4108_4_ == 0) {
      local_1378 = N_local;
    }
    else {
      local_1378 = (size_t *)0x0;
    }
    MangledName_local = (char *)local_1378;
    anon_unknown.dwarf_4161a3::Db::~Db((Db *)&S.CurrentPackIndex);
  }
  return MangledName_local;
}

Assistant:

char *llvm::itaniumDemangle(const char *MangledName, char *Buf,
                            size_t *N, int *Status) {
  if (MangledName == nullptr || (Buf != nullptr && N == nullptr)) {
    if (Status)
      *Status = demangle_invalid_args;
    return nullptr;
  }

  int InternalStatus = demangle_success;
  Db Parser(MangledName, MangledName + std::strlen(MangledName));
  OutputStream S;

  Node *AST = Parser.parse();

  if (AST == nullptr)
    InternalStatus = demangle_invalid_mangled_name;
  else if (initializeOutputStream(Buf, N, S, 1024))
    InternalStatus = demangle_memory_alloc_failure;
  else {
    assert(Parser.ForwardTemplateRefs.empty());
    AST->print(S);
    S += '\0';
    if (N != nullptr)
      *N = S.getCurrentPosition();
    Buf = S.getBuffer();
  }

  if (Status)
    *Status = InternalStatus;
  return InternalStatus == demangle_success ? Buf : nullptr;
}